

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

string * __thiscall
duckdb::Node::VerifyAndToString_abi_cxx11_
          (string *__return_storage_ptr__,Node *this,ART *art,bool only_verify)

{
  long lVar1;
  string *psVar2;
  NType type;
  bool bVar3;
  idx_t __val;
  unsafe_optional_ptr<Node> this_00;
  undefined8 *puVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  NType NVar7;
  undefined7 in_register_00000009;
  size_type *psVar8;
  ulong uVar9;
  long *plVar10;
  ulong *puVar11;
  ulong uVar12;
  uint uVar13;
  char cVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  bool in_R8B;
  uint uVar17;
  uint8_t byte;
  string __str;
  string str;
  string __str_1;
  byte local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  ART *local_f8;
  string local_f0;
  uint local_cc;
  Node *local_c8;
  uint local_bc;
  string local_b8;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string *local_58;
  char *local_50 [2];
  char local_40 [16];
  
  uVar12 = (this->super_IndexPointer).data;
  NVar7 = (NType)(uVar12 >> 0x38);
  type = NVar7 & 0x7f;
  local_f8 = art;
  if (type == PREFIX) {
    Prefix::VerifyAndToString_abi_cxx11_
              (&local_f0,(Prefix *)art,(ART *)this,(Node *)(ulong)only_verify,in_R8B);
    if ((long)(this->super_IndexPointer).data < 0) {
      ::std::operator+(&local_118,"Gate [ ",&local_f0);
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_118);
      psVar8 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_138.field_2._M_allocated_capacity = *psVar8;
        local_138.field_2._8_8_ = plVar5[3];
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar8;
        local_138._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_138._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
    }
    if (only_verify) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,anon_var_dwarf_4f001a4 + 9);
    }
    else {
      ::std::operator+(__return_storage_ptr__,anon_var_dwarf_4f000dd + 8,&local_f0);
    }
    psVar2 = &local_f0;
  }
  else {
    NVar7 = NVar7 & 0x7f;
    if (NVar7 == LEAF) {
      Leaf::DeprecatedVerifyAndToString_abi_cxx11_
                (__return_storage_ptr__,(Leaf *)art,(ART *)this,(Node *)(ulong)only_verify,in_R8B);
      return __return_storage_ptr__;
    }
    uVar13 = (uint)CONCAT71(in_register_00000009,only_verify);
    if (NVar7 != LEAF_INLINED) {
      local_58 = __return_storage_ptr__;
      __val = GetCapacity(type);
      cVar14 = '\x01';
      if (9 < __val) {
        cVar14 = '\x03' - (__val < 100);
      }
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_118,cVar14);
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                (local_118._M_dataplus._M_p,(uint)local_118._M_string_length,__val);
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x1dd433d);
      paVar6 = &local_138.field_2;
      psVar8 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_138.field_2._M_allocated_capacity = *psVar8;
        local_138.field_2._8_8_ = puVar4[3];
        local_138._M_dataplus._M_p = (pointer)paVar6;
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar8;
        local_138._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_138._M_string_length = puVar4[1];
      *puVar4 = psVar8;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_138);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_f0.field_2._M_allocated_capacity = *psVar8;
        local_f0.field_2._8_8_ = plVar5[3];
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar8;
        local_f0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_f0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar6) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      local_139 = 0;
      local_cc = uVar13;
      local_c8 = this;
      if ((byte)((*(byte *)((long)&(this->super_IndexPointer).data + 7) & 0x7f) - 8) < 3) {
        ::std::operator+(&local_138,"Leaf ",&local_f0);
        ::std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar6) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        bVar3 = GetNextByte(this,local_f8,&local_139);
        while (bVar3 != false) {
          uVar13 = (uint)local_139;
          uVar17 = 3 - (local_139 < 100);
          if (local_139 < 10) {
            uVar17 = 1;
          }
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_118,(char)uVar17);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_118._M_dataplus._M_p,uVar17,uVar13);
          puVar4 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          psVar8 = puVar4 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_138.field_2._M_allocated_capacity = *psVar8;
            local_138.field_2._8_8_ = puVar4[3];
          }
          else {
            local_138.field_2._M_allocated_capacity = *psVar8;
            local_138._M_dataplus._M_p = (pointer)*puVar4;
          }
          local_138._M_string_length = puVar4[1];
          *puVar4 = psVar8;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_138._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          if (local_139 == 0xff) break;
          local_139 = local_139 + 1;
          bVar3 = GetNextByte(local_c8,local_f8,&local_139);
        }
      }
      else {
        this_00 = GetNextChildInternal<duckdb::Node_const>(local_f8,this,&local_139);
        local_bc = local_cc & 0xff;
        while (this_00.ptr != (Node *)0x0) {
          uVar17 = (uint)local_139;
          uVar13 = 3 - (local_139 < 100);
          if (local_139 < 10) {
            uVar13 = 1;
          }
          local_50[0] = local_40;
          ::std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar13);
          ::std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0],uVar13,uVar17);
          plVar5 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1e3d62c);
          local_78 = &local_68;
          plVar10 = plVar5 + 2;
          if ((long *)*plVar5 == plVar10) {
            local_68 = *plVar10;
            lStack_60 = plVar5[3];
          }
          else {
            local_68 = *plVar10;
            local_78 = (long *)*plVar5;
          }
          local_70 = plVar5[1];
          *plVar5 = (long)plVar10;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)::std::__cxx11::string::append((char *)&local_78);
          puVar11 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar11) {
            local_88 = *puVar11;
            lStack_80 = plVar5[3];
            local_98 = &local_88;
          }
          else {
            local_88 = *puVar11;
            local_98 = (ulong *)*plVar5;
          }
          local_90 = plVar5[1];
          *plVar5 = (long)puVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          VerifyAndToString_abi_cxx11_(&local_b8,this_00.ptr,local_f8,SUB41(local_bc,0));
          uVar12 = 0xf;
          if (local_98 != &local_88) {
            uVar12 = local_88;
          }
          if (uVar12 < local_b8._M_string_length + local_90) {
            uVar15 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              uVar15 = local_b8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < local_b8._M_string_length + local_90) goto LAB_015c6006;
            puVar4 = (undefined8 *)
                     ::std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98)
            ;
          }
          else {
LAB_015c6006:
            puVar4 = (undefined8 *)
                     ::std::__cxx11::string::_M_append
                               ((char *)&local_98,(ulong)local_b8._M_dataplus._M_p);
          }
          psVar8 = puVar4 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_118.field_2._M_allocated_capacity = *psVar8;
            local_118.field_2._8_8_ = puVar4[3];
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          }
          else {
            local_118.field_2._M_allocated_capacity = *psVar8;
            local_118._M_dataplus._M_p = (pointer)*puVar4;
          }
          local_118._M_string_length = puVar4[1];
          *puVar4 = psVar8;
          puVar4[1] = 0;
          *(undefined1 *)psVar8 = 0;
          puVar4 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
          psVar8 = puVar4 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_138.field_2._M_allocated_capacity = *psVar8;
            local_138.field_2._8_8_ = puVar4[3];
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          }
          else {
            local_138.field_2._M_allocated_capacity = *psVar8;
            local_138._M_dataplus._M_p = (pointer)*puVar4;
          }
          local_138._M_string_length = puVar4[1];
          *puVar4 = psVar8;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_138._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          if (local_98 != &local_88) {
            operator_delete(local_98);
          }
          if (local_78 != &local_68) {
            operator_delete(local_78);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          if (local_139 == 0xff) break;
          local_139 = local_139 + 1;
          this_00 = GetNextChildInternal<duckdb::Node_const>(local_f8,local_c8,&local_139);
        }
      }
      __return_storage_ptr__ = local_58;
      uVar13 = local_cc;
      if ((long)(local_c8->super_IndexPointer).data < 0) {
        ::std::operator+(&local_118,"Gate [ ",&local_f0);
        puVar4 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
        psVar8 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_138.field_2._M_allocated_capacity = *psVar8;
          local_138.field_2._8_8_ = puVar4[3];
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar8;
          local_138._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_138._M_string_length = puVar4[1];
        *puVar4 = psVar8;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
      }
      if ((char)uVar13 == '\0') {
        ::std::operator+(&local_138,anon_var_dwarf_4f000dd + 8,&local_f0);
        plVar5 = (long *)::std::__cxx11::string::append((char *)&local_138);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar8) {
          lVar1 = plVar5[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
        }
        __return_storage_ptr__->_M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,anon_var_dwarf_4f001a4 + 9);
      }
      if (((char)uVar13 == '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2)) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      paVar6 = &local_f0.field_2;
      _Var16._M_p = local_f0._M_dataplus._M_p;
      goto LAB_015c6498;
    }
    if (only_verify) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,anon_var_dwarf_4f001a4 + 9);
    }
    else {
      uVar12 = uVar12 & 0xffffffffffffff;
      uVar13 = 1;
      if (9 < uVar12) {
        uVar9 = uVar12;
        uVar17 = 4;
        do {
          uVar13 = uVar17;
          if (uVar9 < 100) {
            uVar13 = uVar13 - 2;
            goto LAB_015c6395;
          }
          if (uVar9 < 1000) {
            uVar13 = uVar13 - 1;
            goto LAB_015c6395;
          }
          if (uVar9 < 10000) goto LAB_015c6395;
          bVar3 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          uVar17 = uVar13 + 4;
        } while (bVar3);
        uVar13 = uVar13 + 1;
      }
LAB_015c6395:
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_138,(char)uVar13);
      ::std::__detail::__to_chars_10_impl<unsigned_long>(local_138._M_dataplus._M_p,uVar13,uVar12);
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x1e32273);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      psVar8 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_f0.field_2._M_allocated_capacity = *psVar8;
        local_f0.field_2._8_8_ = puVar4[3];
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar8;
        local_f0._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_f0._M_string_length = puVar4[1];
      *puVar4 = psVar8;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_f0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar8) {
        lVar1 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
    }
    if (only_verify) {
      return __return_storage_ptr__;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    psVar2 = &local_138;
  }
  paVar6 = &psVar2->field_2;
  _Var16._M_p = (pointer)(&paVar6->_M_allocated_capacity)[-2];
LAB_015c6498:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var16._M_p != paVar6) {
    operator_delete(_Var16._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string Node::VerifyAndToString(ART &art, const bool only_verify) const {
	D_ASSERT(HasMetadata());

	auto type = GetType();
	switch (type) {
	case NType::LEAF_INLINED:
		return only_verify ? "" : "Inlined Leaf [row ID: " + to_string(GetRowId()) + "]";
	case NType::LEAF:
		return Leaf::DeprecatedVerifyAndToString(art, *this, only_verify);
	case NType::PREFIX: {
		auto str = Prefix::VerifyAndToString(art, *this, only_verify);
		if (GetGateStatus() == GateStatus::GATE_SET) {
			str = "Gate [ " + str + " ]";
		}
		return only_verify ? "" : "\n" + str;
	}
	default:
		break;
	}

	string str = "Node" + to_string(GetCapacity(type)) + ": [ ";
	uint8_t byte = 0;

	if (IsLeafNode()) {
		str = "Leaf " + str;
		auto has_byte = GetNextByte(art, byte);
		while (has_byte) {
			str += to_string(byte) + "-";
			if (byte == NumericLimits<uint8_t>::Maximum()) {
				break;
			}
			byte++;
			has_byte = GetNextByte(art, byte);
		}
	} else {
		auto child = GetNextChild(art, byte);
		while (child) {
			str += "(" + to_string(byte) + ", " + child->VerifyAndToString(art, only_verify) + ")";
			if (byte == NumericLimits<uint8_t>::Maximum()) {
				break;
			}
			byte++;
			child = GetNextChild(art, byte);
		}
	}

	if (GetGateStatus() == GateStatus::GATE_SET) {
		str = "Gate [ " + str + " ]";
	}
	return only_verify ? "" : "\n" + str + "]";
}